

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Probe.cpp
# Opt level: O2

void __thiscall helics::apps::Probe::Probe(Probe *this,string_view name,string *configString)

{
  App::App(&this->super_App,name,configString);
  (this->super_App)._vptr_App = (_func_int **)&PTR__Probe_00483218;
  Endpoint::Endpoint(&this->endpoint);
  this->connections = 0;
  this->messagesReceived = 0;
  return;
}

Assistant:

Probe::Probe(std::string_view name, const std::string& configString): App(name, configString) {}